

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::FileOptions::MergePartialFromCodedStream
          (FileOptions *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  InternalMetadataWithArena *this_01;
  ArenaStringPtr *this_02;
  ArenaStringPtr *this_03;
  byte *pbVar1;
  ArenaStringPtr *this_04;
  ArenaStringPtr *this_05;
  ArenaStringPtr *this_06;
  ArenaStringPtr *this_07;
  byte bVar2;
  byte *pbVar3;
  void *pvVar4;
  uint8 *puVar5;
  uint uVar6;
  bool bVar7;
  int byte_limit;
  uint32 uVar8;
  Type *this_08;
  unsigned_long uVar9;
  pair<int,_int> pVar10;
  int64 iVar11;
  string *psVar12;
  UnknownFieldSet *pUVar13;
  char cVar14;
  uint uVar15;
  ulong uVar16;
  pair<unsigned_long,_bool> pVar17;
  
  this_04 = &this->php_class_prefix_;
  this_05 = &this->swift_prefix_;
  this_06 = &this->csharp_namespace_;
  this_07 = &this->objc_class_prefix_;
  this_00 = &this->go_package_;
  this_01 = &this->_internal_metadata_;
  this_02 = &this->java_outer_classname_;
  this_03 = &this->java_package_;
LAB_001fcd2d:
  pbVar3 = input->buffer_;
  uVar8 = 0;
  if (pbVar3 < input->buffer_end_) {
    bVar2 = *pbVar3;
    uVar8 = (uint32)bVar2;
    pbVar1 = pbVar3 + 1;
    uVar15 = (uint)bVar2;
    if ((char)bVar2 < '\x01') {
      if ((input->buffer_end_ <= pbVar1) || ((~(uint)*pbVar1 & uVar15) < 0x80)) goto LAB_001fd46a;
      uVar15 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
      input->buffer_ = pbVar3 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar16 = (ulong)uVar15 | 0x100000000;
  }
  else {
LAB_001fd46a:
    uVar8 = io::CodedInputStream::ReadTagFallback(input,uVar8);
    uVar16 = 0;
    if (uVar8 - 1 < 0x3fff) {
      uVar16 = 0x100000000;
    }
    uVar16 = uVar8 | uVar16;
  }
  uVar15 = (uint)uVar16;
  if ((uVar16 & 0x100000000) == 0) goto switchD_001fce03_caseD_2;
  uVar6 = (uint)(uVar16 >> 3) & 0x1fffffff;
  cVar14 = (char)uVar16;
  switch(uVar6) {
  case 1:
    if (cVar14 == '\n') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      psVar12 = (this->java_package_).ptr_;
      if (psVar12 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_03,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        psVar12 = this_03->ptr_;
      }
      bVar7 = internal::WireFormatLite::ReadBytes(input,psVar12);
      if (!bVar7) {
        return false;
      }
      internal::WireFormatLite::VerifyUtf8String
                ((this_03->ptr_->_M_dataplus)._M_p,(int)this_03->ptr_->_M_string_length,PARSE,
                 "google.protobuf.FileOptions.java_package");
      goto LAB_001fcd2d;
    }
    break;
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x13:
  case 0x15:
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x26:
    break;
  case 8:
    if (cVar14 == 'B') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      psVar12 = (this->java_outer_classname_).ptr_;
      if (psVar12 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_02,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        psVar12 = this_02->ptr_;
      }
      bVar7 = internal::WireFormatLite::ReadBytes(input,psVar12);
      if (!bVar7) {
        return false;
      }
      internal::WireFormatLite::VerifyUtf8String
                ((this_02->ptr_->_M_dataplus)._M_p,(int)this_02->ptr_->_M_string_length,PARSE,
                 "google.protobuf.FileOptions.java_outer_classname");
      goto LAB_001fcd2d;
    }
    break;
  case 9:
    if (cVar14 == 'H') {
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar2 = *pbVar3;
        uVar8 = (uint32)bVar2;
        uVar15 = (uint)bVar2;
        if ((char)bVar2 < '\0') goto LAB_001fd4b2;
        input->buffer_ = pbVar3 + 1;
      }
      else {
        uVar8 = 0;
LAB_001fd4b2:
        iVar11 = io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
        uVar15 = (uint)iVar11;
        if (iVar11 < 0) {
          return false;
        }
      }
      if (uVar15 - 1 < 3) {
        pbVar3 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar3 = *pbVar3 | 0x80;
        this->optimize_for_ = uVar15;
      }
      else {
        pvVar4 = (this_01->
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 ).ptr_;
        if (((ulong)pvVar4 & 1) == 0) {
          pUVar13 = internal::
                    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                    ::mutable_unknown_fields_slow
                              (&this_01->
                                super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                              );
        }
        else {
          pUVar13 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
        }
        UnknownFieldSet::AddVarint(pUVar13,9,(long)(int)uVar15);
      }
      goto LAB_001fcd2d;
    }
    break;
  case 10:
    if (cVar14 == 'P') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x80;
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (uVar9 = (unsigned_long)(char)*puVar5, -1 < (long)uVar9))
      {
        input->buffer_ = puVar5 + 1;
      }
      else {
        pVar17 = io::CodedInputStream::ReadVarint64Fallback(input);
        uVar9 = pVar17.first;
        if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->java_multiple_files_ = uVar9 != 0;
      goto LAB_001fcd2d;
    }
    break;
  case 0xb:
    if (cVar14 == 'Z') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      psVar12 = (this->go_package_).ptr_;
      if (psVar12 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_00,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        psVar12 = this_00->ptr_;
      }
      bVar7 = internal::WireFormatLite::ReadBytes(input,psVar12);
      if (!bVar7) {
        return false;
      }
      internal::WireFormatLite::VerifyUtf8String
                ((this_00->ptr_->_M_dataplus)._M_p,(int)this_00->ptr_->_M_string_length,PARSE,
                 "google.protobuf.FileOptions.go_package");
      goto LAB_001fcd2d;
    }
    break;
  case 0x10:
    break;
  case 0x11:
    if (cVar14 == -0x78) {
      pbVar3 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar3 = *pbVar3 | 8;
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (uVar9 = (unsigned_long)(char)*puVar5, -1 < (long)uVar9))
      {
        input->buffer_ = puVar5 + 1;
      }
      else {
        pVar17 = io::CodedInputStream::ReadVarint64Fallback(input);
        uVar9 = pVar17.first;
        if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->java_generic_services_ = uVar9 != 0;
      goto LAB_001fcd2d;
    }
    break;
  case 0x12:
    if (cVar14 == -0x70) {
      pbVar3 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar3 = *pbVar3 | 0x10;
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (uVar9 = (unsigned_long)(char)*puVar5, -1 < (long)uVar9))
      {
        input->buffer_ = puVar5 + 1;
      }
      else {
        pVar17 = io::CodedInputStream::ReadVarint64Fallback(input);
        uVar9 = pVar17.first;
        if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->py_generic_services_ = uVar9 != 0;
      goto LAB_001fcd2d;
    }
    break;
  case 0x14:
    if (cVar14 == -0x60) {
      pbVar3 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar3 = *pbVar3 | 1;
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (uVar9 = (unsigned_long)(char)*puVar5, -1 < (long)uVar9))
      {
        input->buffer_ = puVar5 + 1;
      }
      else {
        pVar17 = io::CodedInputStream::ReadVarint64Fallback(input);
        uVar9 = pVar17.first;
        if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->java_generate_equals_and_hash_ = uVar9 != 0;
      goto LAB_001fcd2d;
    }
    break;
  case 0x17:
    if (cVar14 == -0x48) {
      pbVar3 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar3 = *pbVar3 | 0x20;
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (uVar9 = (unsigned_long)(char)*puVar5, -1 < (long)uVar9))
      {
        input->buffer_ = puVar5 + 1;
      }
      else {
        pVar17 = io::CodedInputStream::ReadVarint64Fallback(input);
        uVar9 = pVar17.first;
        if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->deprecated_ = uVar9 != 0;
      goto LAB_001fcd2d;
    }
    break;
  case 0x1b:
    if (cVar14 == -0x28) {
      pbVar3 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar3 = *pbVar3 | 2;
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (uVar9 = (unsigned_long)(char)*puVar5, -1 < (long)uVar9))
      {
        input->buffer_ = puVar5 + 1;
      }
      else {
        pVar17 = io::CodedInputStream::ReadVarint64Fallback(input);
        uVar9 = pVar17.first;
        if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->java_string_check_utf8_ = uVar9 != 0;
      goto LAB_001fcd2d;
    }
    break;
  case 0x1f:
    if (cVar14 == -8) {
      pbVar3 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar3 = *pbVar3 | 0x40;
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (uVar9 = (unsigned_long)(char)*puVar5, -1 < (long)uVar9))
      {
        input->buffer_ = puVar5 + 1;
      }
      else {
        pVar17 = io::CodedInputStream::ReadVarint64Fallback(input);
        uVar9 = pVar17.first;
        if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->cc_enable_arenas_ = uVar9 != 0;
      goto LAB_001fcd2d;
    }
    break;
  case 0x24:
    if (cVar14 == '\"') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      psVar12 = (this->objc_class_prefix_).ptr_;
      if (psVar12 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_07,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        psVar12 = this_07->ptr_;
      }
      bVar7 = internal::WireFormatLite::ReadBytes(input,psVar12);
      if (!bVar7) {
        return false;
      }
      internal::WireFormatLite::VerifyUtf8String
                ((this_07->ptr_->_M_dataplus)._M_p,(int)this_07->ptr_->_M_string_length,PARSE,
                 "google.protobuf.FileOptions.objc_class_prefix");
      goto LAB_001fcd2d;
    }
    break;
  case 0x25:
    if (cVar14 == '*') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
      psVar12 = (this->csharp_namespace_).ptr_;
      if (psVar12 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_06,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        psVar12 = this_06->ptr_;
      }
      bVar7 = internal::WireFormatLite::ReadBytes(input,psVar12);
      if (!bVar7) {
        return false;
      }
      internal::WireFormatLite::VerifyUtf8String
                ((this_06->ptr_->_M_dataplus)._M_p,(int)this_06->ptr_->_M_string_length,PARSE,
                 "google.protobuf.FileOptions.csharp_namespace");
      goto LAB_001fcd2d;
    }
    break;
  case 0x27:
    if (cVar14 == ':') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
      psVar12 = (this->swift_prefix_).ptr_;
      if (psVar12 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_05,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        psVar12 = this_05->ptr_;
      }
      bVar7 = internal::WireFormatLite::ReadBytes(input,psVar12);
      if (!bVar7) {
        return false;
      }
      internal::WireFormatLite::VerifyUtf8String
                ((this_05->ptr_->_M_dataplus)._M_p,(int)this_05->ptr_->_M_string_length,PARSE,
                 "google.protobuf.FileOptions.swift_prefix");
      goto LAB_001fcd2d;
    }
    break;
  case 0x28:
    if (cVar14 == 'B') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x40;
      psVar12 = (this->php_class_prefix_).ptr_;
      if (psVar12 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_04,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        psVar12 = this_04->ptr_;
      }
      bVar7 = internal::WireFormatLite::ReadBytes(input,psVar12);
      if (!bVar7) {
        return false;
      }
      internal::WireFormatLite::VerifyUtf8String
                ((this_04->ptr_->_M_dataplus)._M_p,(int)this_04->ptr_->_M_string_length,PARSE,
                 "google.protobuf.FileOptions.php_class_prefix");
      goto LAB_001fcd2d;
    }
    break;
  default:
    if ((uVar6 != 999) || (cVar14 != ':')) break;
    this_08 = internal::RepeatedPtrFieldBase::
              Add<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                        (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,(Type *)0x0);
    puVar5 = input->buffer_;
    if ((puVar5 < input->buffer_end_) && (byte_limit = (int)(char)*puVar5, -1 < byte_limit)) {
      input->buffer_ = puVar5 + 1;
    }
    else {
      byte_limit = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
      if (byte_limit < 0) {
        return false;
      }
    }
    pVar10 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,byte_limit);
    if ((long)pVar10 < 0) {
      return false;
    }
    bVar7 = UninterpretedOption::MergePartialFromCodedStream(this_08,input);
    if (!bVar7) {
      return false;
    }
    bVar7 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar10.first);
    if (!bVar7) {
      return false;
    }
    goto LAB_001fcd2d;
  }
switchD_001fce03_caseD_2:
  if (uVar15 == 0) {
    return true;
  }
  if ((uVar15 & 7) == 4) {
    return true;
  }
  pvVar4 = (this_01->
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ).ptr_;
  if (uVar15 < 8000) {
    if (((ulong)pvVar4 & 1) == 0) {
      pUVar13 = internal::
                InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                ::mutable_unknown_fields_slow
                          (&this_01->
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          );
    }
    else {
      pUVar13 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
    }
    bVar7 = internal::WireFormat::SkipField(input,uVar15,pUVar13);
  }
  else {
    if (((ulong)pvVar4 & 1) == 0) {
      pUVar13 = internal::
                InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                ::mutable_unknown_fields_slow
                          (&this_01->
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          );
    }
    else {
      pUVar13 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
    }
    bVar7 = internal::ExtensionSet::ParseField
                      (&this->_extensions_,uVar15,input,(Message *)&_FileOptions_default_instance_,
                       pUVar13);
  }
  if (bVar7 == false) {
    return false;
  }
  goto LAB_001fcd2d;
}

Assistant:

bool FileOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.FileOptions)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string java_package = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_java_package()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->java_package().data(), this->java_package().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.java_package");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string java_outer_classname = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_java_outer_classname()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->java_outer_classname().data(), this->java_outer_classname().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.java_outer_classname");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(72u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FileOptions_OptimizeMode_IsValid(value)) {
            set_optimize_for(static_cast< ::google::protobuf::FileOptions_OptimizeMode >(value));
          } else {
            mutable_unknown_fields()->AddVarint(9, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool java_multiple_files = 10 [default = false];
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          set_has_java_multiple_files();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_multiple_files_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string go_package = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(90u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_go_package()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->go_package().data(), this->go_package().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.go_package");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool cc_generic_services = 16 [default = false];
      case 16: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(128u)) {
          set_has_cc_generic_services();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &cc_generic_services_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool java_generic_services = 17 [default = false];
      case 17: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(136u)) {
          set_has_java_generic_services();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_generic_services_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool py_generic_services = 18 [default = false];
      case 18: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(144u)) {
          set_has_py_generic_services();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &py_generic_services_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool java_generate_equals_and_hash = 20 [deprecated = true];
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(160u)) {
          set_has_java_generate_equals_and_hash();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_generate_equals_and_hash_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool deprecated = 23 [default = false];
      case 23: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(184u)) {
          set_has_deprecated();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &deprecated_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool java_string_check_utf8 = 27 [default = false];
      case 27: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(216u)) {
          set_has_java_string_check_utf8();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &java_string_check_utf8_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool cc_enable_arenas = 31 [default = false];
      case 31: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(248u)) {
          set_has_cc_enable_arenas();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &cc_enable_arenas_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string objc_class_prefix = 36;
      case 36: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(290u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_objc_class_prefix()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->objc_class_prefix().data(), this->objc_class_prefix().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.objc_class_prefix");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string csharp_namespace = 37;
      case 37: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(298u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_csharp_namespace()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->csharp_namespace().data(), this->csharp_namespace().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.csharp_namespace");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string swift_prefix = 39;
      case 39: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(314u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_swift_prefix()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->swift_prefix().data(), this->swift_prefix().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.swift_prefix");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string php_class_prefix = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(322u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_php_class_prefix()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->php_class_prefix().data(), this->php_class_prefix().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileOptions.php_class_prefix");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(7994u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, internal_default_instance(),
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.FileOptions)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.FileOptions)
  return false;
#undef DO_
}